

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_or.hpp
# Opt level: O3

void __thiscall
pstore::
error_or<std::tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_pstore::http::frame>_>
::~error_or(error_or<std::tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_pstore::http::frame>_>
            *this)

{
  pointer puVar1;
  tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_pstore::http::frame>
  *ptVar2;
  
  if (this->has_error_ != false) {
    error_or<std::tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>,pstore::http::frame>>
    ::
    error_storage_impl<pstore::error_or<std::tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>,pstore::http::frame>>&,std::error_code>
              (this);
    return;
  }
  ptVar2 = error_or<std::tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>,pstore::http::frame>>
           ::
           value_storage_impl<pstore::error_or<std::tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>,pstore::http::frame>>&,std::tuple<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>,pstore::http::frame>>
                     (this);
  puVar1 = (ptVar2->
           super__Tuple_impl<0UL,_std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_pstore::http::frame>
           ).super__Tuple_impl<1UL,_pstore::http::frame>.
           super__Head_base<1UL,_pstore::http::frame,_false>._M_head_impl.payload.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)*(pointer *)
                                  ((long)&(ptVar2->
                                          super__Tuple_impl<0UL,_std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_pstore::http::frame>
                                          ).super__Tuple_impl<1UL,_pstore::http::frame>.
                                          super__Head_base<1UL,_pstore::http::frame,_false>.
                                          _M_head_impl.payload.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl + 0x10) - (long)puVar1);
    return;
  }
  return;
}

Assistant:

error_or<T>::~error_or () {
        if (!has_error_) {
            get_storage ()->~storage_type ();
        } else {
            using error_code = std::error_code;
            get_error_storage ()->~error_code ();
        }
    }